

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-trait-swap.c
# Opt level: O3

_Bool borg_has_bad_curse(borg_item_conflict *item)

{
  _Bool _Var1;
  
  _Var1 = true;
  if ((((((item->curses[2] == false) && (item->curses[0xb] == false)) &&
        (item->curses[0xc] == false)) &&
       ((item->curses[0xd] == false && (item->curses[0xe] == false)))) &&
      ((item->curses[0x10] == false &&
       ((item->curses[0xf] == false && (item->curses[0x11] == false)))))) &&
     ((item->curses[0x15] == false &&
      ((item->curses[0x16] == false && (item->curses[0x17] == false)))))) {
    _Var1 = item->curses[0];
  }
  return _Var1;
}

Assistant:

static bool borg_has_bad_curse(borg_item *item)
{
    if (item->curses[BORG_CURSE_TELEPORTATION]
        || item->curses[BORG_CURSE_POISON] || item->curses[BORG_CURSE_SIREN]
        || item->curses[BORG_CURSE_HALLUCINATION]
        || item->curses[BORG_CURSE_PARALYSIS]
        || item->curses[BORG_CURSE_DEMON_SUMMON]
        || item->curses[BORG_CURSE_DRAGON_SUMMON]
        || item->curses[BORG_CURSE_UNDEAD_SUMMON]
        || item->curses[BORG_CURSE_STONE]
        || item->curses[BORG_CURSE_ANTI_TELEPORTATION]
        || item->curses[BORG_CURSE_TREACHEROUS_WEAPON]
        || item->curses[BORG_CURSE_UNKNOWN])
        return true;
    return false;
}